

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_external_file_cache.cpp
# Opt level: O1

void duckdb::DuckDBExternalFileCacheFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  GlobalTableFunctionState *pGVar1;
  pointer pcVar2;
  reference pvVar3;
  long lVar4;
  idx_t iVar5;
  _func_int **__n;
  ulong index;
  bool bVar6;
  string local_90;
  Value local_70;
  
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid(&data_p->global_state);
  pGVar1 = (data_p->global_state).ptr;
  if (pGVar1[4]._vptr_GlobalTableFunctionState <
      (_func_int **)
      (((long)pGVar1[2]._vptr_GlobalTableFunctionState -
        (long)pGVar1[1]._vptr_GlobalTableFunctionState >> 3) * 0x6db6db6db6db6db7)) {
    __n = pGVar1[4]._vptr_GlobalTableFunctionState;
    if (__n < (_func_int **)
              (((long)pGVar1[2]._vptr_GlobalTableFunctionState -
                (long)pGVar1[1]._vptr_GlobalTableFunctionState >> 3) * 0x6db6db6db6db6db7)) {
      index = 0;
      do {
        pGVar1[4]._vptr_GlobalTableFunctionState = (_func_int **)((long)__n + 1);
        pvVar3 = vector<duckdb::CachedFileInformation,_true>::operator[]
                           ((vector<duckdb::CachedFileInformation,_true> *)(pGVar1 + 1),
                            (size_type)__n);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        pcVar2 = (pvVar3->path)._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar2,pcVar2 + (pvVar3->path)._M_string_length);
        Value::Value(&local_70,&local_90);
        DataChunk::SetValue(output,0,index,&local_70);
        Value::~Value(&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        lVar4 = NumericCastImpl<long,_unsigned_long,_false>::Convert(pvVar3->nr_bytes);
        Value::BIGINT(&local_70,lVar4);
        DataChunk::SetValue(output,1,index,&local_70);
        Value::~Value(&local_70);
        lVar4 = NumericCastImpl<long,_unsigned_long,_false>::Convert(pvVar3->location);
        Value::BIGINT(&local_70,lVar4);
        DataChunk::SetValue(output,2,index,&local_70);
        Value::~Value(&local_70);
        Value::Value(&local_70,(uint)pvVar3->loaded);
        DataChunk::SetValue(output,3,index,&local_70);
        Value::~Value(&local_70);
        iVar5 = index + 1;
        __n = pGVar1[4]._vptr_GlobalTableFunctionState;
      } while ((__n < (_func_int **)
                      (((long)pGVar1[2]._vptr_GlobalTableFunctionState -
                        (long)pGVar1[1]._vptr_GlobalTableFunctionState >> 3) * 0x6db6db6db6db6db7))
              && (bVar6 = index < 0x7ff, index = iVar5, bVar6));
    }
    else {
      iVar5 = 0;
    }
    output->count = iVar5;
  }
  return;
}

Assistant:

void DuckDBExternalFileCacheFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBExternalFileCacheData>();
	if (data.offset >= data.entries.size()) {
		// finished returning values
		return;
	}
	// start returning values
	// either fill up the chunk or return all the remaining columns
	idx_t count = 0;
	while (data.offset < data.entries.size() && count < STANDARD_VECTOR_SIZE) {
		auto &entry = data.entries[data.offset++];
		// return values:
		idx_t col = 0;
		// path, VARCHAR
		output.SetValue(col++, count, entry.path);
		// nr_bytes, BIGINT
		output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(entry.nr_bytes)));
		// location, BIGINT
		output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(entry.location)));
		// loaded, BOOLEAN
		output.SetValue(col++, count, entry.loaded);
		count++;
	}
	output.SetCardinality(count);
}